

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.cpp
# Opt level: O0

void mjs::debug_print(wostream *os,value *v,int indent_incr,int max_nest,int indent)

{
  int iVar1;
  value *pvVar2;
  bool bVar3;
  value_type vVar4;
  const_iterator pvVar5;
  object *this;
  reference *prVar6;
  object_ptr *poVar7;
  wostream *__os;
  string *psVar8;
  basic_ostream<wchar_t,_std::char_traits<wchar_t>_> *pbVar9;
  char *pcVar10;
  double m;
  wstring_view __str;
  undefined1 local_a8 [24];
  object_ptr b;
  value_type *ch;
  const_iterator __end2;
  const_iterator __begin2;
  basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *local_60;
  wstring_view *__range2;
  wstring local_48;
  int local_24;
  int local_20;
  int indent_local;
  int max_nest_local;
  int indent_incr_local;
  value *v_local;
  wostream *os_local;
  
  local_24 = indent;
  local_20 = max_nest;
  indent_local = indent_incr;
  _max_nest_local = v;
  v_local = (value *)os;
  vVar4 = value::type(v);
  pvVar2 = v_local;
  switch(vVar4) {
  case undefined:
  case null:
    vVar4 = value::type(_max_nest_local);
    operator<<((basic_ostream<wchar_t,_std::char_traits<wchar_t>_> *)pvVar2,vVar4);
    break;
  case boolean:
    bVar3 = value::boolean_value(_max_nest_local);
    pcVar10 = "false";
    if (bVar3) {
      pcVar10 = "true";
    }
    std::operator<<((wostream *)pvVar2,pcVar10);
    break;
  case number:
    m = value::number_value(_max_nest_local);
    number_to_string_abi_cxx11_(&local_48,(mjs *)v,m);
    std::operator<<((wostream *)pvVar2,(wstring *)&local_48);
    std::__cxx11::wstring::~wstring((wstring *)&local_48);
    break;
  case string:
    std::operator<<((wostream *)v_local,"\'");
    psVar8 = value::string_value(_max_nest_local);
    ___begin2 = string::view(psVar8);
    local_60 = (basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)&__begin2;
    __end2 = std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::begin(local_60);
    pvVar5 = std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::end(local_60);
    for (; __end2 != pvVar5; __end2 = __end2 + 1) {
      b.super_gc_heap_ptr_untyped._8_8_ = __end2;
      iVar1 = *__end2;
      if (iVar1 == 8) {
        std::operator<<((wostream *)v_local,"\\b");
      }
      else if (iVar1 == 9) {
        std::operator<<((wostream *)v_local,"\\t");
      }
      else if (iVar1 == 10) {
        std::operator<<((wostream *)v_local,"\\n");
      }
      else if (iVar1 == 0xc) {
        std::operator<<((wostream *)v_local,"\\f");
      }
      else if (iVar1 == 0xd) {
        std::operator<<((wostream *)v_local,"\\r");
      }
      else if (iVar1 == 0x27) {
        std::operator<<((wostream *)v_local,"\\\'");
      }
      else if (iVar1 == 0x5c) {
        std::operator<<((wostream *)v_local,"\\\\");
      }
      else {
        std::operator<<((wostream *)v_local,*__end2);
      }
    }
    std::operator<<((wostream *)v_local,"\'");
    break;
  case object:
    poVar7 = value::object_value(_max_nest_local);
    this = gc_heap_ptr<mjs::object>::operator->(poVar7);
    object::debug_print(this,(wostream *)v_local,indent_local,local_20,local_24);
    break;
  case reference:
    std::operator<<((wostream *)v_local,"reference to ");
    prVar6 = value::reference_value(_max_nest_local);
    poVar7 = reference::base(prVar6);
    gc_heap_ptr<mjs::object>::gc_heap_ptr((gc_heap_ptr<mjs::object> *)(local_a8 + 0x10),poVar7);
    bVar3 = gc_heap_ptr_untyped::operator_cast_to_bool((gc_heap_ptr_untyped *)(local_a8 + 0x10));
    pvVar2 = v_local;
    if (bVar3) {
      gc_heap_ptr<mjs::object>::operator->((gc_heap_ptr<mjs::object> *)(local_a8 + 0x10));
      object::class_name((object *)local_a8);
      operator<<((wostream *)pvVar2,(string *)local_a8);
      string::~string((string *)local_a8);
    }
    else {
      std::operator<<((wostream *)v_local,"null");
    }
    gc_heap_ptr<mjs::object>::~gc_heap_ptr((gc_heap_ptr<mjs::object> *)(local_a8 + 0x10));
    __os = std::operator<<((wostream *)v_local," \'");
    prVar6 = value::reference_value(_max_nest_local);
    psVar8 = reference::property_name(prVar6);
    __str = string::view(psVar8);
    pbVar9 = std::operator<<(__os,__str);
    std::operator<<(pbVar9,"\'");
    break;
  default:
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/value.cpp",
                  0x113,"void mjs::debug_print(std::wostream &, const value &, int, int, int)");
  }
  return;
}

Assistant:

void debug_print(std::wostream& os, const value& v, int indent_incr, int max_nest, int indent) {
    switch (v.type()) {
    case value_type::undefined: [[fallthrough]];
    case value_type::null:
        os << v.type();
        break;
    case value_type::boolean:
        os << (v.boolean_value() ? "true" : "false");
        break;
    case value_type::number:
        os << number_to_string(v.number_value());
        break;
    case value_type::string:
        os << "'";
        for (const auto& ch: v.string_value().view()) {
            switch (ch) {
            case '\'': os << "\\'"; break;
            case '\\': os << "\\\\"; break;
            case '\b': os << "\\b"; break;
            case '\f': os << "\\f"; break;
            case '\n': os << "\\n"; break;
            case '\r': os << "\\r"; break;
            case '\t': os << "\\t"; break;
            default:
                os << ch;
            }
        }
        os << "'";
        break;
    case value_type::object:
        v.object_value()->debug_print(os, indent_incr, max_nest, indent);
        break;
    case value_type::reference:
        os << "reference to ";
        if (auto b = v.reference_value().base()) {
            os << b->class_name();
        } else {
            os << "null";
        }
        os << " '" << v.reference_value().property_name().view() << "'";
        break;
    default:
        assert(false);
        os << "[Unhandled type " << v.type() << "]";
    }
}